

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall
cimg_library::CImg<unsigned_char>::CImg
          (CImg<unsigned_char> *this,uchar *values,uint size_x,uint size_y,uint size_z,uint size_c,
          bool is_shared)

{
  ulong __n;
  uchar *puVar1;
  unsigned_long siz;
  bool is_shared_local;
  uint size_c_local;
  uint size_z_local;
  uint size_y_local;
  uint size_x_local;
  uchar *values_local;
  CImg<unsigned_char> *this_local;
  
  __n = (ulong)size_x * (ulong)size_y * (ulong)size_z * (ulong)size_c;
  if ((values == (uchar *)0x0) || (__n == 0)) {
    this->_spectrum = 0;
    this->_depth = 0;
    this->_height = 0;
    this->_width = 0;
    this->_is_shared = false;
    this->_data = (uchar *)0x0;
  }
  else {
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
    this->_is_shared = is_shared;
    if ((this->_is_shared & 1U) == 0) {
      puVar1 = (uchar *)operator_new__(__n);
      this->_data = puVar1;
      memcpy(this->_data,values,__n);
    }
    else {
      this->_data = values;
    }
  }
  return;
}

Assistant:

CImg(const T *const values, const unsigned int size_x, const unsigned int size_y=1,
         const unsigned int size_z=1, const unsigned int size_c=1, const bool is_shared=false) {
      const unsigned long siz = (unsigned long)size_x*size_y*size_z*size_c;
      if (values && siz) {
        _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c; _is_shared = is_shared;
        if (_is_shared) _data = const_cast<T*>(values);
        else {
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "CImg(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),size_x,size_y,size_z,size_c);
          }
          std::memcpy(_data,values,siz*sizeof(T)); }
      } else { _width = _height = _depth = _spectrum = 0; _is_shared = false; _data = 0; }
    }